

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Visitor<wasm::BinaryenIRWriter<wasm::StackIRGenerator>,_void>::visit
          (Visitor<wasm::BinaryenIRWriter<wasm::StackIRGenerator>,_void> *this,Expression *curr)

{
  Expression *curr_local;
  Visitor<wasm::BinaryenIRWriter<wasm::StackIRGenerator>,_void> *this_local;
  
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      BinaryenIRWriter<wasm::StackIRGenerator>::visitBlock
                ((BinaryenIRWriter<wasm::StackIRGenerator> *)this,(Block *)curr);
      break;
    case IfId:
      BinaryenIRWriter<wasm::StackIRGenerator>::visitIf
                ((BinaryenIRWriter<wasm::StackIRGenerator> *)this,(If *)curr);
      break;
    case LoopId:
      BinaryenIRWriter<wasm::StackIRGenerator>::visitLoop
                ((BinaryenIRWriter<wasm::StackIRGenerator> *)this,(Loop *)curr);
      break;
    case BreakId:
      visitBreak(this,(Break *)curr);
      break;
    case SwitchId:
      visitSwitch(this,(Switch *)curr);
      break;
    case CallId:
      visitCall(this,(Call *)curr);
      break;
    case CallIndirectId:
      visitCallIndirect(this,(CallIndirect *)curr);
      break;
    case LocalGetId:
      visitLocalGet(this,(LocalGet *)curr);
      break;
    case LocalSetId:
      visitLocalSet(this,(LocalSet *)curr);
      break;
    case GlobalGetId:
      visitGlobalGet(this,(GlobalGet *)curr);
      break;
    case GlobalSetId:
      visitGlobalSet(this,(GlobalSet *)curr);
      break;
    case LoadId:
      visitLoad(this,(Load *)curr);
      break;
    case StoreId:
      visitStore(this,(Store *)curr);
      break;
    case ConstId:
      visitConst(this,(Const *)curr);
      break;
    case UnaryId:
      visitUnary(this,(Unary *)curr);
      break;
    case BinaryId:
      visitBinary(this,(Binary *)curr);
      break;
    case SelectId:
      visitSelect(this,(Select *)curr);
      break;
    case DropId:
      visitDrop(this,(Drop *)curr);
      break;
    case ReturnId:
      visitReturn(this,(Return *)curr);
      break;
    case MemorySizeId:
      visitMemorySize(this,(MemorySize *)curr);
      break;
    case MemoryGrowId:
      visitMemoryGrow(this,(MemoryGrow *)curr);
      break;
    case NopId:
      visitNop(this,(Nop *)curr);
      break;
    case UnreachableId:
      visitUnreachable(this,(Unreachable *)curr);
      break;
    case AtomicRMWId:
      visitAtomicRMW(this,(AtomicRMW *)curr);
      break;
    case AtomicCmpxchgId:
      visitAtomicCmpxchg(this,(AtomicCmpxchg *)curr);
      break;
    case AtomicWaitId:
      visitAtomicWait(this,(AtomicWait *)curr);
      break;
    case AtomicNotifyId:
      visitAtomicNotify(this,(AtomicNotify *)curr);
      break;
    case AtomicFenceId:
      visitAtomicFence(this,(AtomicFence *)curr);
      break;
    case SIMDExtractId:
      visitSIMDExtract(this,(SIMDExtract *)curr);
      break;
    case SIMDReplaceId:
      visitSIMDReplace(this,(SIMDReplace *)curr);
      break;
    case SIMDShuffleId:
      visitSIMDShuffle(this,(SIMDShuffle *)curr);
      break;
    case SIMDTernaryId:
      visitSIMDTernary(this,(SIMDTernary *)curr);
      break;
    case SIMDShiftId:
      visitSIMDShift(this,(SIMDShift *)curr);
      break;
    case SIMDLoadId:
      visitSIMDLoad(this,(SIMDLoad *)curr);
      break;
    case SIMDLoadStoreLaneId:
      visitSIMDLoadStoreLane(this,(SIMDLoadStoreLane *)curr);
      break;
    case MemoryInitId:
      visitMemoryInit(this,(MemoryInit *)curr);
      break;
    case DataDropId:
      visitDataDrop(this,(DataDrop *)curr);
      break;
    case MemoryCopyId:
      visitMemoryCopy(this,(MemoryCopy *)curr);
      break;
    case MemoryFillId:
      visitMemoryFill(this,(MemoryFill *)curr);
      break;
    case PopId:
      visitPop(this,(Pop *)curr);
      break;
    case RefNullId:
      visitRefNull(this,(RefNull *)curr);
      break;
    case RefIsNullId:
      visitRefIsNull(this,(RefIsNull *)curr);
      break;
    case RefFuncId:
      visitRefFunc(this,(RefFunc *)curr);
      break;
    case RefEqId:
      visitRefEq(this,(RefEq *)curr);
      break;
    case TableGetId:
      visitTableGet(this,(TableGet *)curr);
      break;
    case TableSetId:
      visitTableSet(this,(TableSet *)curr);
      break;
    case TableSizeId:
      visitTableSize(this,(TableSize *)curr);
      break;
    case TableGrowId:
      visitTableGrow(this,(TableGrow *)curr);
      break;
    case TableFillId:
      visitTableFill(this,(TableFill *)curr);
      break;
    case TableCopyId:
      visitTableCopy(this,(TableCopy *)curr);
      break;
    case TableInitId:
      visitTableInit(this,(TableInit *)curr);
      break;
    case TryId:
      BinaryenIRWriter<wasm::StackIRGenerator>::visitTry
                ((BinaryenIRWriter<wasm::StackIRGenerator> *)this,(Try *)curr);
      break;
    case TryTableId:
      BinaryenIRWriter<wasm::StackIRGenerator>::visitTryTable
                ((BinaryenIRWriter<wasm::StackIRGenerator> *)this,(TryTable *)curr);
      break;
    case ThrowId:
      visitThrow(this,(Throw *)curr);
      break;
    case RethrowId:
      visitRethrow(this,(Rethrow *)curr);
      break;
    case ThrowRefId:
      visitThrowRef(this,(ThrowRef *)curr);
      break;
    case TupleMakeId:
      visitTupleMake(this,(TupleMake *)curr);
      break;
    case TupleExtractId:
      visitTupleExtract(this,(TupleExtract *)curr);
      break;
    case RefI31Id:
      visitRefI31(this,(RefI31 *)curr);
      break;
    case I31GetId:
      visitI31Get(this,(I31Get *)curr);
      break;
    case CallRefId:
      visitCallRef(this,(CallRef *)curr);
      break;
    case RefTestId:
      visitRefTest(this,(RefTest *)curr);
      break;
    case RefCastId:
      visitRefCast(this,(RefCast *)curr);
      break;
    case BrOnId:
      visitBrOn(this,(BrOn *)curr);
      break;
    case StructNewId:
      visitStructNew(this,(StructNew *)curr);
      break;
    case StructGetId:
      visitStructGet(this,(StructGet *)curr);
      break;
    case StructSetId:
      visitStructSet(this,(StructSet *)curr);
      break;
    case StructRMWId:
      visitStructRMW(this,(StructRMW *)curr);
      break;
    case StructCmpxchgId:
      visitStructCmpxchg(this,(StructCmpxchg *)curr);
      break;
    case ArrayNewId:
      visitArrayNew(this,(ArrayNew *)curr);
      break;
    case ArrayNewDataId:
      visitArrayNewData(this,(ArrayNewData *)curr);
      break;
    case ArrayNewElemId:
      visitArrayNewElem(this,(ArrayNewElem *)curr);
      break;
    case ArrayNewFixedId:
      visitArrayNewFixed(this,(ArrayNewFixed *)curr);
      break;
    case ArrayGetId:
      visitArrayGet(this,(ArrayGet *)curr);
      break;
    case ArraySetId:
      visitArraySet(this,(ArraySet *)curr);
      break;
    case ArrayLenId:
      visitArrayLen(this,(ArrayLen *)curr);
      break;
    case ArrayCopyId:
      visitArrayCopy(this,(ArrayCopy *)curr);
      break;
    case ArrayFillId:
      visitArrayFill(this,(ArrayFill *)curr);
      break;
    case ArrayInitDataId:
      visitArrayInitData(this,(ArrayInitData *)curr);
      break;
    case ArrayInitElemId:
      visitArrayInitElem(this,(ArrayInitElem *)curr);
      break;
    case RefAsId:
      visitRefAs(this,(RefAs *)curr);
      break;
    case StringNewId:
      visitStringNew(this,(StringNew *)curr);
      break;
    case StringConstId:
      visitStringConst(this,(StringConst *)curr);
      break;
    case StringMeasureId:
      visitStringMeasure(this,(StringMeasure *)curr);
      break;
    case StringEncodeId:
      visitStringEncode(this,(StringEncode *)curr);
      break;
    case StringConcatId:
      visitStringConcat(this,(StringConcat *)curr);
      break;
    case StringEqId:
      visitStringEq(this,(StringEq *)curr);
      break;
    case StringWTF16GetId:
      visitStringWTF16Get(this,(StringWTF16Get *)curr);
      break;
    case StringSliceWTFId:
      visitStringSliceWTF(this,(StringSliceWTF *)curr);
      break;
    case ContNewId:
      visitContNew(this,(ContNew *)curr);
      break;
    case ContBindId:
      visitContBind(this,(ContBind *)curr);
      break;
    case SuspendId:
      visitSuspend(this,(Suspend *)curr);
      break;
    case ResumeId:
      visitResume(this,(Resume *)curr);
      break;
    case ResumeThrowId:
      visitResumeThrow(this,(ResumeThrow *)curr);
      break;
    case StackSwitchId:
      visitStackSwitch(this,(StackSwitch *)curr);
      break;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    return;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::BinaryenIRWriter<wasm::StackIRGenerator>>::visit(Expression *) [SubType = wasm::BinaryenIRWriter<wasm::StackIRGenerator>, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }